

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrUtil.c
# Opt level: O0

void Rwr_ManLoadFromFile(Rwr_Man_t *p,char *pFileName)

{
  uint fExor_00;
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  int RetValue;
  abctime clk;
  int i;
  int fExor;
  int nEntries;
  int Volume;
  int Level;
  uint *pBuffer;
  Rwr_Node_t *p1;
  Rwr_Node_t *p0;
  FILE *pFile;
  char *pFileName_local;
  Rwr_Man_t *p_local;
  
  pFile = (FILE *)pFileName;
  pFileName_local = (char *)p;
  aVar2 = Abc_Clock();
  p0 = (Rwr_Node_t *)fopen((char *)pFile,"rb");
  if ((FILE *)p0 == (FILE *)0x0) {
    printf("Rwr_ManLoadFromFile: Cannot open file \"%s\".\n",pFile);
  }
  else {
    fread(&i,4,1,(FILE *)p0);
    _Volume = malloc((long)(i << 1) << 2);
    fread(_Volume,4,(long)(i << 1),(FILE *)p0);
    fclose((FILE *)p0);
    for (clk._4_4_ = 0; clk._4_4_ < i; clk._4_4_ = clk._4_4_ + 1) {
      fExor_00 = *(uint *)((long)_Volume + (long)(clk._4_4_ << 1) * 4) & 1;
      *(uint *)((long)_Volume + (long)(clk._4_4_ << 1) * 4) =
           *(uint *)((long)_Volume + (long)(clk._4_4_ << 1) * 4) >> 1;
      p1 = *(Rwr_Node_t **)
            (*(long *)(*(long *)(pFileName_local + 0x40) + 8) +
            (ulong)(*(uint *)((long)_Volume + (long)(clk._4_4_ << 1) * 4) >> 1) * 8);
      pBuffer = *(uint **)(*(long *)(*(long *)(pFileName_local + 0x40) + 8) +
                          (ulong)(*(uint *)((long)_Volume + (long)(clk._4_4_ * 2 + 1) * 4) >> 1) * 8
                          );
      iVar1 = Abc_MaxInt(*(uint *)&p1->field_0xe >> 0x18 & 0x3f,
                         *(uint *)((long)pBuffer + 0xe) >> 0x18 & 0x3f);
      nEntries = iVar1 + 1;
      iVar1 = Rwr_ManNodeVolume((Rwr_Man_t *)pFileName_local,p1,(Rwr_Node_t *)pBuffer);
      fExor = iVar1 + 1;
      p1 = Rwr_NotCond(p1,*(uint *)((long)_Volume + (long)(clk._4_4_ << 1) * 4) & 1);
      pBuffer = (uint *)Rwr_NotCond((Rwr_Node_t *)pBuffer,
                                    *(uint *)((long)_Volume + (long)(clk._4_4_ * 2 + 1) * 4) & 1);
      Rwr_ManAddNode((Rwr_Man_t *)pFileName_local,p1,(Rwr_Node_t *)pBuffer,fExor_00,nEntries,
                     fExor + fExor_00);
    }
    if (_Volume != (void *)0x0) {
      free(_Volume);
      _Volume = (void *)0x0;
    }
    printf("The number of classes = %d. Canonical nodes = %d.\n",
           (ulong)*(uint *)(pFileName_local + 0x6c),(ulong)*(uint *)(pFileName_local + 0x68));
    printf("The number of nodes loaded = %d.   ",(ulong)(uint)i);
    Abc_Print(1,"%s =","Loading");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar2) * 1.0) / 1000000.0);
  }
  return;
}

Assistant:

void Rwr_ManLoadFromFile( Rwr_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Rwr_Node_t * p0, * p1;
    unsigned * pBuffer;
    int Level, Volume, nEntries, fExor;
    int i;
    abctime clk = Abc_Clock();
    int RetValue;

    // load the data
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Rwr_ManLoadFromFile: Cannot open file \"%s\".\n", pFileName );
        return;
    }
    RetValue = fread( &nEntries, sizeof(int), 1, pFile );
    pBuffer = ABC_ALLOC( unsigned, nEntries * 2 );
    RetValue = fread( pBuffer, sizeof(unsigned), nEntries * 2, pFile );
    fclose( pFile );
    // reconstruct the forest
    for ( i = 0; i < nEntries; i++ )
    {
        // get EXOR flag
        fExor = (pBuffer[2*i + 0] & 1);
        pBuffer[2*i + 0] = (pBuffer[2*i + 0] >> 1);
        // get the nodes
        p0 = (Rwr_Node_t *)p->vForest->pArray[pBuffer[2*i + 0] >> 1];
        p1 = (Rwr_Node_t *)p->vForest->pArray[pBuffer[2*i + 1] >> 1];
        // compute the level and volume of the new nodes
        Level  = 1 + Abc_MaxInt( p0->Level, p1->Level );
        Volume = 1 + Rwr_ManNodeVolume( p, p0, p1 );
        // set the complemented attributes
        p0 = Rwr_NotCond( p0, (pBuffer[2*i + 0] & 1) );
        p1 = Rwr_NotCond( p1, (pBuffer[2*i + 1] & 1) );
        // add the node
//        Rwr_ManTryNode( p, p0, p1, Level, Volume );
        Rwr_ManAddNode( p, p0, p1, fExor, Level, Volume + fExor );
    }
    ABC_FREE( pBuffer );
    printf( "The number of classes = %d. Canonical nodes = %d.\n", p->nClasses, p->nAdded );
    printf( "The number of nodes loaded = %d.   ", nEntries );  ABC_PRT( "Loading", Abc_Clock() - clk );
}